

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O0

void __thiscall
DIS::ElectromagneticEmissionsPdu::unmarshal
          (ElectromagneticEmissionsPdu *this,DataStream *dataStream)

{
  undefined1 local_70 [8];
  ElectromagneticEmissionSystemData x;
  size_t idx;
  DataStream *dataStream_local;
  ElectromagneticEmissionsPdu *this_local;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::unmarshal(&this->_eventID,dataStream);
  DataStream::operator>>(dataStream,&this->_stateUpdateIndicator);
  DataStream::operator>>(dataStream,&this->_numberOfSystems);
  DataStream::operator>>(dataStream,&this->_paddingForEmissionsPdu);
  std::
  vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
  ::clear(&this->_systems);
  for (x._beamDataRecords.
       super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      x._beamDataRecords.
      super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)(ulong)this->_numberOfSystems;
      x._beamDataRecords.
      super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(x._beamDataRecords.
                             super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            _vptr_ElectromagneticEmissionBeamData + 1)) {
    ElectromagneticEmissionSystemData::ElectromagneticEmissionSystemData
              ((ElectromagneticEmissionSystemData *)local_70);
    ElectromagneticEmissionSystemData::unmarshal
              ((ElectromagneticEmissionSystemData *)local_70,dataStream);
    std::
    vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
    ::push_back(&this->_systems,(value_type *)local_70);
    ElectromagneticEmissionSystemData::~ElectromagneticEmissionSystemData
              ((ElectromagneticEmissionSystemData *)local_70);
  }
  return;
}

Assistant:

void ElectromagneticEmissionsPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _emittingEntityID.unmarshal(dataStream);
    _eventID.unmarshal(dataStream);
    dataStream >> _stateUpdateIndicator;
    dataStream >> _numberOfSystems;
    dataStream >> _paddingForEmissionsPdu;

    _systems.clear();
    for(size_t idx = 0; idx < _numberOfSystems; idx++)
    {
        ElectromagneticEmissionSystemData x;
        x.unmarshal(dataStream);
        _systems.push_back(x);
    }
}